

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgsequ.c
# Opt level: O0

void cgsequ(SuperMatrix *A,float *r,float *c,float *rowcnd,float *colcnd,float *amax,int *info)

{
  float fVar1;
  double dVar2;
  float local_c8;
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  double local_a8;
  float local_98;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  double local_78;
  int local_68;
  float local_64;
  int ii;
  float smlnum;
  float bignum;
  float rcmax;
  float rcmin;
  int irow;
  int_t j;
  int_t i;
  singlecomplex *Aval;
  NCformat *Astore;
  float *amax_local;
  float *colcnd_local;
  float *rowcnd_local;
  float *c_local;
  float *r_local;
  SuperMatrix *A_local;
  
  *info = 0;
  if ((((A->nrow < 0) || (A->ncol < 0)) || (A->Stype != SLU_NC)) ||
     ((A->Dtype != SLU_C || (A->Mtype != SLU_GE)))) {
    *info = -1;
  }
  Astore = (NCformat *)amax;
  amax_local = colcnd;
  colcnd_local = rowcnd;
  rowcnd_local = c;
  c_local = r;
  r_local = (float *)A;
  if (*info == 0) {
    if ((A->nrow == 0) || (A->ncol == 0)) {
      *rowcnd = 1.0;
      *colcnd = 1.0;
      *amax = 0.0;
    }
    else {
      Aval = (singlecomplex *)A->Store;
      _j = Aval[1];
      local_64 = smach("S");
      ii = (int)(1.0 / local_64);
      for (irow = 0; irow < (int)r_local[3]; irow = irow + 1) {
        c_local[irow] = 0.0;
      }
      for (rcmin = 0.0; (int)rcmin < (int)r_local[4]; rcmin = (float)((int)rcmin + 1)) {
        for (irow = *(int *)((long)Aval[3] + (long)(int)rcmin * 4);
            irow < *(int *)((long)Aval[3] + (long)((int)rcmin + 1) * 4); irow = irow + 1) {
          rcmax = *(float *)((long)Aval[2] + (long)irow * 4);
          fVar1 = c_local[(int)rcmax];
          dVar2 = c_abs1((singlecomplex *)((long)_j + (long)irow * 8));
          if ((double)fVar1 <= dVar2) {
            local_78 = c_abs1((singlecomplex *)((long)_j + (long)irow * 8));
          }
          else {
            local_78 = (double)c_local[(int)rcmax];
          }
          c_local[(int)rcmax] = (float)local_78;
        }
      }
      bignum = (float)ii;
      smlnum = 0.0;
      for (irow = 0; irow < (int)r_local[3]; irow = irow + 1) {
        if (smlnum < c_local[irow] || smlnum == c_local[irow]) {
          local_7c = c_local[irow];
        }
        else {
          local_7c = smlnum;
        }
        smlnum = local_7c;
        if (c_local[irow] <= bignum) {
          local_80 = c_local[irow];
        }
        else {
          local_80 = bignum;
        }
        bignum = local_80;
      }
      Astore->nnz = (int_t)smlnum;
      if ((bignum != 0.0) || (NAN(bignum))) {
        for (irow = 0; irow < (int)r_local[3]; irow = irow + 1) {
          if (c_local[irow] <= local_64) {
            local_84 = local_64;
          }
          else {
            local_84 = c_local[irow];
          }
          if ((float)ii <= local_84) {
            local_8c = (float)ii;
          }
          else {
            if (c_local[irow] <= local_64) {
              local_88 = local_64;
            }
            else {
              local_88 = c_local[irow];
            }
            local_8c = local_88;
          }
          c_local[irow] = 1.0 / local_8c;
        }
        if (bignum <= local_64) {
          local_90 = local_64;
        }
        else {
          local_90 = bignum;
        }
        if ((float)ii <= smlnum) {
          local_98 = (float)ii;
        }
        else {
          local_98 = smlnum;
        }
        *colcnd_local = local_90 / local_98;
      }
      else {
        for (irow = 0; irow < (int)r_local[3]; irow = irow + 1) {
          if ((c_local[irow] == 0.0) && (!NAN(c_local[irow]))) {
            *info = irow + 1;
            return;
          }
        }
      }
      for (rcmin = 0.0; (int)rcmin < (int)r_local[4]; rcmin = (float)((int)rcmin + 1)) {
        rowcnd_local[(int)rcmin] = 0.0;
      }
      for (rcmin = 0.0; (int)rcmin < (int)r_local[4]; rcmin = (float)((int)rcmin + 1)) {
        for (irow = *(int *)((long)Aval[3] + (long)(int)rcmin * 4);
            irow < *(int *)((long)Aval[3] + (long)((int)rcmin + 1) * 4); irow = irow + 1) {
          rcmax = *(float *)((long)Aval[2] + (long)irow * 4);
          fVar1 = rowcnd_local[(int)rcmin];
          dVar2 = c_abs1((singlecomplex *)((long)_j + (long)irow * 8));
          if ((double)fVar1 <= dVar2 * (double)c_local[(int)rcmax]) {
            local_a8 = c_abs1((singlecomplex *)((long)_j + (long)irow * 8));
            local_a8 = local_a8 * (double)c_local[(int)rcmax];
          }
          else {
            local_a8 = (double)rowcnd_local[(int)rcmin];
          }
          rowcnd_local[(int)rcmin] = (float)local_a8;
        }
      }
      bignum = (float)ii;
      smlnum = 0.0;
      for (rcmin = 0.0; (int)rcmin < (int)r_local[4]; rcmin = (float)((int)rcmin + 1)) {
        if (smlnum < rowcnd_local[(int)rcmin] || smlnum == rowcnd_local[(int)rcmin]) {
          local_ac = rowcnd_local[(int)rcmin];
        }
        else {
          local_ac = smlnum;
        }
        smlnum = local_ac;
        if (rowcnd_local[(int)rcmin] <= bignum) {
          local_b0 = rowcnd_local[(int)rcmin];
        }
        else {
          local_b0 = bignum;
        }
        bignum = local_b0;
      }
      if ((bignum != 0.0) || (NAN(bignum))) {
        for (rcmin = 0.0; (int)rcmin < (int)r_local[4]; rcmin = (float)((int)rcmin + 1)) {
          if (rowcnd_local[(int)rcmin] <= local_64) {
            local_b4 = local_64;
          }
          else {
            local_b4 = rowcnd_local[(int)rcmin];
          }
          if ((float)ii <= local_b4) {
            local_bc = (float)ii;
          }
          else {
            if (rowcnd_local[(int)rcmin] <= local_64) {
              local_b8 = local_64;
            }
            else {
              local_b8 = rowcnd_local[(int)rcmin];
            }
            local_bc = local_b8;
          }
          rowcnd_local[(int)rcmin] = 1.0 / local_bc;
        }
        if (bignum <= local_64) {
          local_c0 = local_64;
        }
        else {
          local_c0 = bignum;
        }
        if ((float)ii <= smlnum) {
          local_c8 = (float)ii;
        }
        else {
          local_c8 = smlnum;
        }
        *amax_local = local_c0 / local_c8;
      }
      else {
        for (rcmin = 0.0; (int)rcmin < (int)r_local[4]; rcmin = (float)((int)rcmin + 1)) {
          if ((rowcnd_local[(int)rcmin] == 0.0) && (!NAN(rowcnd_local[(int)rcmin]))) {
            *info = (int)r_local[3] + (int)rcmin + 1;
            return;
          }
        }
      }
    }
  }
  else {
    local_68 = -*info;
    input_error("cgsequ",&local_68);
  }
  return;
}

Assistant:

void
cgsequ(SuperMatrix *A, float *r, float *c, float *rowcnd,
	float *colcnd, float *amax, int *info)
{


    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    int_t i, j;
    int   irow;
    float rcmin, rcmax;
    float bignum, smlnum;
    extern float smach(char *);
    
    /* Test the input parameters. */
    *info = 0;
    if ( A->nrow < 0 || A->ncol < 0 ||
	 A->Stype != SLU_NC || A->Dtype != SLU_C || A->Mtype != SLU_GE )
	*info = -1;
    if (*info != 0) {
	int ii = -(*info);
	input_error("cgsequ", &ii);
	return;
    }

    /* Quick return if possible */
    if ( A->nrow == 0 || A->ncol == 0 ) {
	*rowcnd = 1.;
	*colcnd = 1.;
	*amax = 0.;
	return;
    }

    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Get machine constants. */
    smlnum = smach("S");  /* slamch_("S"); */
    bignum = 1. / smlnum;

    /* Compute row scale factors. */
    for (i = 0; i < A->nrow; ++i) r[i] = 0.;

    /* Find the maximum element in each row. */
    for (j = 0; j < A->ncol; ++j)
	for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
	    irow = Astore->rowind[i];
	    r[irow] = SUPERLU_MAX( r[irow], c_abs1(&Aval[i]) );
	}

    /* Find the maximum and minimum scale factors. */
    rcmin = bignum;
    rcmax = 0.;
    for (i = 0; i < A->nrow; ++i) {
	rcmax = SUPERLU_MAX(rcmax, r[i]);
	rcmin = SUPERLU_MIN(rcmin, r[i]);
    }
    *amax = rcmax;

    if (rcmin == 0.) {
	/* Find the first zero scale factor and return an error code. */
	for (i = 0; i < A->nrow; ++i)
	    if (r[i] == 0.) {
		*info = i + 1;
		return;
	    }
    } else {
	/* Invert the scale factors. */
	for (i = 0; i < A->nrow; ++i)
	    r[i] = 1. / SUPERLU_MIN( SUPERLU_MAX( r[i], smlnum ), bignum );
	/* Compute ROWCND = min(R(I)) / max(R(I)) */
	*rowcnd = SUPERLU_MAX( rcmin, smlnum ) / SUPERLU_MIN( rcmax, bignum );
    }

    /* Compute column scale factors */
    for (j = 0; j < A->ncol; ++j) c[j] = 0.;

    /* Find the maximum element in each column, assuming the row
       scalings computed above. */
    for (j = 0; j < A->ncol; ++j)
	for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
	    irow = Astore->rowind[i];
	    c[j] = SUPERLU_MAX( c[j], c_abs1(&Aval[i]) * r[irow] );
	}

    /* Find the maximum and minimum scale factors. */
    rcmin = bignum;
    rcmax = 0.;
    for (j = 0; j < A->ncol; ++j) {
	rcmax = SUPERLU_MAX(rcmax, c[j]);
	rcmin = SUPERLU_MIN(rcmin, c[j]);
    }

    if (rcmin == 0.) {
	/* Find the first zero scale factor and return an error code. */
	for (j = 0; j < A->ncol; ++j)
	    if ( c[j] == 0. ) {
		*info = A->nrow + j + 1;
		return;
	    }
    } else {
	/* Invert the scale factors. */
	for (j = 0; j < A->ncol; ++j)
	    c[j] = 1. / SUPERLU_MIN( SUPERLU_MAX( c[j], smlnum ), bignum);
	/* Compute COLCND = min(C(J)) / max(C(J)) */
	*colcnd = SUPERLU_MAX( rcmin, smlnum ) / SUPERLU_MIN( rcmax, bignum );
    }

    return;

}